

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<short,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  long lVar1;
  short *v_t;
  size_type *psVar2;
  short sVar3;
  Vector *pVVar4;
  uint64_t uVar5;
  reference q_00;
  idx_t iVar6;
  FunctionData *pFVar7;
  uint64_t uVar8;
  unsigned_long *q;
  size_type *psVar9;
  idx_t n;
  QuantileDirect<short> local_89;
  list_entry_t *local_88;
  FunctionData *local_80;
  AggregateFinalizeData *local_78;
  Vector *local_70;
  long local_68;
  FunctionData *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    local_88 = target;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar7 = (this->bind_data).ptr;
    pVVar4 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar5 = duckdb::ListVector::GetListSize(finalize_data->result);
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar7 + 0x10) - *(long *)(pFVar7 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5 + uVar5)
    ;
    lVar1 = *(long *)(pVVar4 + 0x20);
    v_t = (state->v).super_vector<short,_std::allocator<short>_>.
          super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start
    ;
    local_88->offset = uVar5;
    psVar9 = *(size_type **)(pFVar7 + 0x20);
    psVar2 = *(size_type **)(pFVar7 + 0x28);
    if (psVar9 != psVar2) {
      local_60 = pFVar7 + 8;
      local_68 = lVar1 + uVar5 * 2;
      iVar6 = 0;
      local_80 = pFVar7;
      local_78 = finalize_data;
      local_70 = pVVar4;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[]
                         ((vector<duckdb::QuantileValue,_true> *)local_60,*psVar9);
        n = (long)(state->v).super_vector<short,_std::allocator<short>_>.
                  super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)(state->v).super_vector<short,_std::allocator<short>_>.
                  super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 1;
        local_58.desc = *(bool *)(local_80 + 0x38);
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar6;
        local_58.end = n;
        sVar3 = Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
                          (&local_58,v_t,local_70,&local_89);
        *(short *)(local_68 + *psVar9 * 2) = sVar3;
        psVar9 = psVar9 + 1;
        iVar6 = local_58.FRN;
      } while (psVar9 != psVar2);
      uVar5 = local_88->offset;
      pFVar7 = local_80;
      finalize_data = local_78;
    }
    uVar8 = (*(long *)(pFVar7 + 0x10) - *(long *)(pFVar7 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5;
    local_88->length = uVar8;
    duckdb::ListVector::SetListSize(finalize_data->result,uVar8 + uVar5);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}